

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

void req0_sock_fini(void *arg)

{
  nni_mtx *mtx;
  int iVar1;
  
  nni_aio_stop((nni_aio *)((long)arg + 0x130));
  mtx = (nni_mtx *)((long)arg + 0x358);
  nni_mtx_lock(mtx);
  iVar1 = nni_list_empty((nni_list *)((long)arg + 0xb8));
  if (iVar1 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req.c"
              ,0x94,"nni_list_empty(&s->busy_pipes)");
  }
  iVar1 = nni_list_empty((nni_list *)((long)arg + 0xd0));
  if (iVar1 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req.c"
              ,0x95,"nni_list_empty(&s->stop_pipes)");
  }
  iVar1 = nni_list_empty((nni_list *)((long)arg + 0xa0));
  if (iVar1 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req.c"
              ,0x96,"nni_list_empty(&s->ready_pipes)");
  }
  nni_mtx_unlock(mtx);
  req0_ctx_fini((void *)((long)arg + 0x10));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x330));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x340));
  nni_id_map_fini((nni_id_map *)((long)arg + 0x2f8));
  nni_aio_fini((nni_aio *)((long)arg + 0x130));
  nni_mtx_fini(mtx);
  return;
}

Assistant:

static void
req0_sock_fini(void *arg)
{
	req0_sock *s = arg;

	nni_aio_stop(&s->retry_aio);
	nni_mtx_lock(&s->mtx);
	NNI_ASSERT(nni_list_empty(&s->busy_pipes));
	NNI_ASSERT(nni_list_empty(&s->stop_pipes));
	NNI_ASSERT(nni_list_empty(&s->ready_pipes));
	nni_mtx_unlock(&s->mtx);

	req0_ctx_fini(&s->master);
	nni_pollable_fini(&s->readable);
	nni_pollable_fini(&s->writable);
	nni_id_map_fini(&s->requests);
	nni_aio_fini(&s->retry_aio);
	nni_mtx_fini(&s->mtx);
}